

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::rayTest
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  ulong uVar1;
  
  if (this->m_raycastAccelerator != (btDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[6])();
    return;
  }
  if ((this->m_numHandles & 0x7fffffff) != 0) {
    uVar1 = 0;
    do {
      if ((this->m_pEdges[0][uVar1 + 1].m_pos & 1) != 0) {
        (*(rayCallback->super_btBroadphaseAabbCallback)._vptr_btBroadphaseAabbCallback[2])
                  (rayCallback,this->m_pHandles + this->m_pEdges[0][uVar1 + 1].m_handle);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_numHandles * 2);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom,rayTo,rayCallback,aabbMin,aabbMax);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}